

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_bench.cc
# Opt level: O3

void randomize_size_classes(void)

{
  size_t sVar1;
  
  randomize_one_size_class(8);
  sVar1 = 0;
  do {
    sVar1 = sVar1 + 0x10;
    randomize_one_size_class(sVar1);
  } while (sVar1 < 0xf0);
  sVar1 = 0xe0;
  do {
    sVar1 = sVar1 + 0x20;
    randomize_one_size_class(sVar1);
  } while (sVar1 < 0x1e0);
  sVar1 = 0x1c0;
  do {
    sVar1 = sVar1 + 0x40;
    randomize_one_size_class(sVar1);
  } while (sVar1 < 0x3c0);
  sVar1 = 0x380;
  do {
    sVar1 = sVar1 + 0x80;
    randomize_one_size_class(sVar1);
  } while (sVar1 < 0xf80);
  sVar1 = 0xc00;
  do {
    sVar1 = sVar1 + 0x400;
    randomize_one_size_class(sVar1);
  } while (sVar1 < 0x7c00);
  return;
}

Assistant:

void randomize_size_classes() {
  randomize_one_size_class(8);
  int i;
  for (i = 16; i < 256; i += 16) {
    randomize_one_size_class(i);
  }
  for (; i < 512; i += 32) {
    randomize_one_size_class(i);
  }
  for (; i < 1024; i += 64) {
    randomize_one_size_class(i);
  }
  for (; i < (4 << 10); i += 128) {
    randomize_one_size_class(i);
  }
  for (; i < (32 << 10); i += 1024) {
    randomize_one_size_class(i);
  }
}